

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  long lVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  Expr *pEVar5;
  void *pvVar6;
  int in_ECX;
  Parse *in_RDX;
  WhereTerm *in_RSI;
  long *in_RDI;
  uint in_R8D;
  int in_R9D;
  int iCol;
  int iOut;
  int iMap;
  sqlite3 *db;
  int *aiMap;
  int nEq;
  int i;
  WhereLoop *pLoop;
  InLoop *pIn;
  int iTab;
  int eType;
  int iReg;
  Vdbe *v;
  Expr *pX;
  undefined4 in_stack_00000058;
  int in_stack_0000015c;
  Expr *in_stack_00000160;
  Parse *in_stack_00000168;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  void *in_stack_ffffffffffffff88;
  sqlite3 *db_00;
  int iVar7;
  int iVar8;
  int *local_58;
  int local_48;
  int local_44;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_28;
  
  pEVar5 = in_RSI->pExpr;
  if ((pEVar5->op == '5') || (pEVar5->op == '-')) {
    local_44 = sqlite3ExprCodeTarget(in_stack_00000168,in_stack_00000160,in_stack_0000015c);
  }
  else {
    local_44 = in_R9D;
    if (pEVar5->op == '2') {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0);
    }
    else {
      local_48 = 5;
      lVar1 = *(long *)&in_RDX->nLabel;
      iVar7 = 0;
      db_00 = (sqlite3 *)0x0;
      local_28 = in_R8D;
      if ((((*(uint *)(lVar1 + 0x28) & 0x400) == 0) && (*(long *)(lVar1 + 0x20) != 0)) &&
         (*(char *)(*(long *)(*(long *)(lVar1 + 0x20) + 0x38) + (long)in_ECX) != '\0')) {
        local_28 = (uint)((in_R8D != 0 ^ 0xffU) & 1);
      }
      for (iVar8 = 0; iVar3 = in_ECX, iVar8 < in_ECX; iVar8 = iVar8 + 1) {
        if ((*(long *)(*(long *)(lVar1 + 0x38) + (long)iVar8 * 8) != 0) &&
           ((Expr *)**(undefined8 **)(*(long *)(lVar1 + 0x38) + (long)iVar8 * 8) == pEVar5)) {
          disableTerm((WhereLevel *)in_RDX,in_RSI);
          return in_R9D;
        }
      }
      for (; iVar3 < (int)(uint)*(ushort *)(lVar1 + 0x2c); iVar3 = iVar3 + 1) {
        if ((Expr *)**(undefined8 **)(*(long *)(lVar1 + 0x38) + (long)iVar3 * 8) == pEVar5) {
          iVar7 = iVar7 + 1;
        }
      }
      if (((pEVar5->flags & 0x800) == 0) || (((pEVar5->x).pSelect)->pEList->nExpr == 1)) {
        local_48 = sqlite3FindInIndex((Parse *)CONCAT44(iEq,bRev),
                                      (Expr *)CONCAT44(iTarget,in_stack_00000058),pX._4_4_,(int *)v,
                                      _eType);
      }
      else {
        in_stack_ffffffffffffff88 = (void *)*in_RDI;
        pEVar5 = removeUnindexableInClauseTerms
                           (in_RDX,in_ECX,(WhereLoop *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                            pEVar5);
        if (*(char *)((long)in_stack_ffffffffffffff88 + 0x61) == '\0') {
          db_00 = (sqlite3 *)
                  sqlite3DbMallocZero((sqlite3 *)
                                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
          ;
          local_48 = sqlite3FindInIndex((Parse *)CONCAT44(iEq,bRev),
                                        (Expr *)CONCAT44(iTarget,in_stack_00000058),pX._4_4_,
                                        (int *)v,_eType);
          in_RSI->pExpr->iTable = pEVar5->iTable;
        }
        sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (Expr *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        pEVar5 = in_RSI->pExpr;
      }
      if (local_48 == 4) {
        local_28 = (uint)((local_28 != 0 ^ 0xffU) & 1);
      }
      iVar8 = pEVar5->iTable;
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0);
      *(uint *)(lVar1 + 0x28) = *(uint *)(lVar1 + 0x28) | 0x800;
      if (in_RDX->nMem == 0) {
        iVar3 = sqlite3VdbeMakeLabel
                          ((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        *(int *)&in_RDX->pVdbe = iVar3;
      }
      iVar3 = in_RDX->nMem;
      in_RDX->nMem = iVar7 + in_RDX->nMem;
      pvVar6 = sqlite3DbReallocOrFree
                         (db_00,in_stack_ffffffffffffff88,
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      *(void **)&in_RDX->szOpAlloc = pvVar6;
      if (*(long *)&in_RDX->szOpAlloc == 0) {
        in_RDX->nMem = 0;
      }
      else {
        in_stack_ffffffffffffff84 = 0;
        local_58 = (int *)(*(long *)&in_RDX->szOpAlloc + (long)iVar3 * 0x14);
        iVar3 = in_ECX;
        for (; in_ECX < (int)(uint)*(ushort *)(lVar1 + 0x2c); in_ECX = in_ECX + 1) {
          if ((Expr *)**(undefined8 **)(*(long *)(lVar1 + 0x38) + (long)in_ECX * 8) == pEVar5) {
            in_stack_ffffffffffffff80 = (in_R9D + in_ECX) - iVar3;
            if (local_48 == 1) {
              iVar4 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,
                                                         in_stack_ffffffffffffff80),
                                        in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0);
              local_58[1] = iVar4;
            }
            else {
              if (db_00 == (sqlite3 *)0x0) {
                in_stack_ffffffffffffff78 = 0;
              }
              else {
                in_stack_ffffffffffffff78 = db_00->aLimit[(long)in_stack_ffffffffffffff84 + -0x1f];
                in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1;
              }
              in_stack_ffffffffffffff7c = in_stack_ffffffffffffff78;
              iVar4 = sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_ECX,iVar7),(int)((ulong)db_00 >> 0x20),
                                        (int)db_00,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                        (int)in_stack_ffffffffffffff88);
              local_58[1] = iVar4;
            }
            sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
            if (in_ECX == iVar3) {
              *local_58 = iVar8;
              uVar2 = 5;
              if (local_28 != 0) {
                uVar2 = 4;
              }
              *(undefined1 *)(local_58 + 4) = uVar2;
              if ((iVar3 < 1) || ((*(uint *)(lVar1 + 0x28) & 0x400) != 0)) {
                local_58[3] = 0;
              }
              else {
                local_58[2] = in_R9D - in_ECX;
                local_58[3] = in_ECX;
                *(uint *)(lVar1 + 0x28) = *(uint *)(lVar1 + 0x28) | 0x40000;
              }
            }
            else {
              *(undefined1 *)(local_58 + 4) = 0xab;
            }
            local_58 = local_58 + 5;
          }
        }
      }
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  disableTerm((WhereLevel *)in_RDX,in_RSI);
  return local_44;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    if( (pX->flags & EP_xIsSelect)==0 || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0);
    }else{
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);

      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap);
        pTerm->pExpr->iTable = pX->iTable;
      }
      sqlite3ExprDelete(db, pX);
      pX = pTerm->pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    iTab = pX->iTable;
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );

    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(v);
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            testcase( nEq>1 );  /* Happens with a UNIQUE index on ROWID */
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 && (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
              pLoop->wsFlags |= WHERE_IN_EARLYOUT;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}